

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcess.cpp
# Opt level: O1

void ac::core::detail::yuva2rgba<unsigned_char,unsigned_char>
               (Image *srcy,Image *srcu,Image *srcv,Image *srca,Image *dst)

{
  int scale;
  int w;
  anon_class_1_0_00000001 local_51;
  int local_50;
  int local_4c;
  undefined1 local_48 [40];
  Image *local_20;
  Image *local_18;
  Image *local_10;
  
  local_4c = dst->w;
  local_48._0_8_ = &local_4c;
  local_50 = local_4c / srcy->w;
  local_48._24_8_ = &local_50;
  local_48._8_8_ = &local_51;
  local_48._16_8_ = srcy;
  local_48._32_8_ = srcu;
  local_20 = srcv;
  local_18 = srca;
  local_10 = dst;
  core::
  parallelFor<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_include_AC_Core_Util_hpp:114:9)>
            (0,dst->h,(anon_class_64_8_aeed8c52 *)local_48);
  return;
}

Assistant:

inline void yuva2rgba(const Image& srcy, const Image& srcu, const Image& srcv, const Image& srca, Image& dst)
    {
        filter([](const int /*i*/, const int /*j*/, const void* const yptr, const void* const uptr, const void* const vptr, const void* const aptr, void* const dptr) {
            auto yin = static_cast<const IN*>(yptr);
            auto uin = static_cast<const IN*>(uptr);
            auto vin = static_cast<const IN*>(vptr);
            auto ain = static_cast<const IN*>(aptr);
            auto out = static_cast<OUT*>(dptr);

            float y = toFloat(*yin);
            float u = toFloat(*uin) - 0.5f;
            float v = toFloat(*vin) - 0.5f;

            float r = y + 1.403f * v;
            float g = y - 0.344f * u - 0.714f * v;
            float b = y + 1.773f * u;

            out[0] = fromFloat<OUT>(r);
            out[1] = fromFloat<OUT>(g);
            out[2] = fromFloat<OUT>(b);
            if constexpr (std::is_same_v<IN, OUT>) out[3] = *ain;
            else out[3] = fromFloat<OUT>(toFloat(*ain));
        }, srcy, srcu, srcv, srca, dst);
    }